

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdecode.cpp
# Opt level: O1

int libtorrent::anon_unknown_10::line_longer_than(bdecode_node *e,int limit)

{
  bdecode_token bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  bool bVar9;
  pair<boost::basic_string_view<char,_std::char_traits<char>_>,_libtorrent::bdecode_node> local_80;
  
  lVar5 = (long)e->m_token_idx;
  iVar8 = 0;
  uVar7 = 0;
  if (lVar5 != -1) {
    uVar7 = *(uint *)(e->m_root_tokens + lVar5) >> 0x1d;
  }
  switch(uVar7) {
  case 0:
    iVar8 = 4;
    break;
  case 1:
    if (limit < 4) {
      return -1;
    }
    iVar2 = bdecode_node::dict_size(e);
    bVar9 = 0 < iVar2;
    iVar8 = 4;
    if (0 < iVar2) {
      iVar2 = 0;
      do {
        bdecode_node::dict_at(&local_80,e,iVar2);
        iVar3 = (int)local_80.first.len_;
        if (local_80.second.m_tokens.
            super_vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
            .
            super__Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_80.second.m_tokens.
                          super_vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                          .
                          super__Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_80.second.m_tokens.
                                super_vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                                .
                                super__Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_80.second.m_tokens.
                                super_vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                                .
                                super__Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        iVar8 = iVar8 + iVar3 + 4;
        if (limit < iVar8) break;
        bdecode_node::dict_at(&local_80,e,iVar2);
        iVar3 = line_longer_than(&local_80.second,limit - iVar8);
        if (local_80.second.m_tokens.
            super_vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
            .
            super__Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_80.second.m_tokens.
                          super_vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                          .
                          super__Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_80.second.m_tokens.
                                super_vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                                .
                                super__Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_80.second.m_tokens.
                                super_vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                                .
                                super__Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        iVar8 = iVar8 + iVar3 + 1;
        if (iVar3 == -1) break;
        iVar2 = iVar2 + 1;
        iVar3 = bdecode_node::dict_size(e);
        bVar9 = iVar2 < iVar3;
      } while (iVar2 < iVar3);
    }
    if (bVar9) {
      return -1;
    }
    break;
  case 2:
    if (limit < 4) {
      return -1;
    }
    iVar2 = bdecode_node::list_size(e);
    bVar9 = 0 < iVar2;
    iVar8 = 4;
    if (0 < iVar2) {
      iVar2 = 0;
      do {
        bdecode_node::list_at((bdecode_node *)&local_80,e,iVar2);
        iVar3 = line_longer_than((bdecode_node *)&local_80,limit - iVar8);
        if (local_80.first.ptr_ != (char *)0x0) {
          operator_delete(local_80.first.ptr_,
                          (long)local_80.second.m_tokens.
                                super_vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                                .
                                super__Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                                ._M_impl.super__Vector_impl_data._M_start -
                          (long)local_80.first.ptr_);
        }
        iVar4 = iVar3 + 2;
        if (iVar3 == -1) {
          iVar4 = 0;
        }
        iVar8 = iVar8 + iVar4;
        if (iVar3 == -1) break;
        iVar2 = iVar2 + 1;
        iVar3 = bdecode_node::list_size(e);
        bVar9 = iVar2 < iVar3;
      } while (iVar2 < iVar3);
    }
    if (bVar9) {
      return -1;
    }
    break;
  case 3:
    bVar1 = e->m_root_tokens[lVar5];
    iVar8 = ((*(uint *)(e->m_root_tokens + lVar5 + 1) & 0x1fffffff) -
            ((bVar1._4_4_ >> 0x1d) + (bVar1._0_4_ & 0x1fffffff))) + 1;
    break;
  case 4:
    uVar6 = bdecode_node::int_value(e);
    if ((long)uVar6 < 1) {
      iVar8 = 2;
    }
    else {
      iVar8 = 2;
      do {
        iVar8 = iVar8 + 1;
        bVar9 = 9 < uVar6;
        uVar6 = uVar6 / 10;
      } while (bVar9);
    }
  }
  iVar2 = -1;
  if (iVar8 <= limit) {
    iVar2 = iVar8;
  }
  return iVar2;
}

Assistant:

int line_longer_than(bdecode_node const& e, int limit)
	{
		int line_len = 0;
		switch (e.type())
		{
		case bdecode_node::list_t:
			line_len += 4;
			if (line_len > limit) return -1;
			for (int i = 0; i < e.list_size(); ++i)
			{
				int const ret = line_longer_than(e.list_at(i), limit - line_len);
				if (ret == -1) return -1;
				line_len += ret + 2;
			}
			break;
		case bdecode_node::dict_t:
			line_len += 4;
			if (line_len > limit) return -1;
			for (int i = 0; i < e.dict_size(); ++i)
			{
				line_len += 4 + int(e.dict_at(i).first.size());
				if (line_len > limit) return -1;
				int const ret = line_longer_than(e.dict_at(i).second, limit - line_len);
				if (ret == -1) return -1;
				line_len += ret + 1;
			}
			break;
		case bdecode_node::string_t:
			line_len += 3 + e.string_length();
			break;
		case bdecode_node::int_t:
		{
			std::int64_t val = e.int_value();
			while (val > 0)
			{
				++line_len;
				val /= 10;
			}
			line_len += 2;
		}
		break;
		case bdecode_node::none_t:
			line_len += 4;
			break;
		}

		if (line_len > limit) return -1;
		return line_len;
	}